

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizer.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::DictVectorizer::MergeFrom(DictVectorizer *this,DictVectorizer *from)

{
  void *pvVar1;
  LogMessage *other;
  Int64Vector *this_00;
  Int64Vector *from_00;
  StringVector *this_01;
  StringVector *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/DictVectorizer.pb.cc"
               ,0x120);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->_oneof_case_[0] == 1) {
    this_01 = mutable_stringtoindex(this);
    from_01 = stringtoindex(from);
    StringVector::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 2) {
    this_00 = mutable_int64toindex(this);
    from_00 = int64toindex(from);
    Int64Vector::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

void DictVectorizer::MergeFrom(const DictVectorizer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.DictVectorizer)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.Map_case()) {
    case kStringToIndex: {
      mutable_stringtoindex()->::CoreML::Specification::StringVector::MergeFrom(from.stringtoindex());
      break;
    }
    case kInt64ToIndex: {
      mutable_int64toindex()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64toindex());
      break;
    }
    case MAP_NOT_SET: {
      break;
    }
  }
}